

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

size_type cmSystemToolsFindRPath(string *have,string *want)

{
  size_type sVar1;
  ulong uVar2;
  
  uVar2 = 0;
  do {
    if (have->_M_string_length <= uVar2) {
      return 0xffffffffffffffff;
    }
    sVar1 = std::__cxx11::string::find((string *)have,(ulong)want);
    if (sVar1 == 0) {
LAB_00195dbd:
      uVar2 = want->_M_string_length + sVar1;
      if (have->_M_string_length <= uVar2) {
        return sVar1;
      }
      if ((have->_M_dataplus)._M_p[uVar2] == ':') {
        return sVar1;
      }
    }
    else {
      if (sVar1 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      if ((have->_M_dataplus)._M_p[sVar1 - 1] == ':') goto LAB_00195dbd;
    }
    uVar2 = sVar1 + 1;
  } while( true );
}

Assistant:

std::string::size_type cmSystemToolsFindRPath(std::string const& have,
                                              std::string const& want)
{
  std::string::size_type pos = 0;
  while (pos < have.size()) {
    // Look for an occurrence of the string.
    std::string::size_type const beg = have.find(want, pos);
    if (beg == std::string::npos) {
      return std::string::npos;
    }

    // Make sure it is separated from preceding entries.
    if (beg > 0 && have[beg - 1] != ':') {
      pos = beg + 1;
      continue;
    }

    // Make sure it is separated from following entries.
    std::string::size_type const end = beg + want.size();
    if (end < have.size() && have[end] != ':') {
      pos = beg + 1;
      continue;
    }

    // Return the position of the path portion.
    return beg;
  }

  // The desired rpath was not found.
  return std::string::npos;
}